

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::EventLoop::enterScope(EventLoop *this)

{
  bool bVar1;
  long *in_FS_OFFSET;
  Fault local_50;
  Fault f;
  EventLoop **local_40;
  undefined1 local_38 [8];
  DebugComparison<kj::EventLoop_*&,_std::nullptr_t> _kjCondition;
  EventLoop *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (EventLoop **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (EventLoop **)(*in_FS_OFFSET + -0x28));
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::EventLoop*&>::operator==
            ((DebugComparison<kj::EventLoop_*&,_std::nullptr_t> *)local_38,
             (DebugExpression<kj::EventLoop*&> *)&local_40,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*&,decltype(nullptr)>&,char_const(&)[38]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x74b,FAILED,"threadLocalEventLoop == nullptr",
               "_kjCondition,\"This thread already has an EventLoop.\"",
               (DebugComparison<kj::EventLoop_*&,_std::nullptr_t> *)local_38,
               (char (*) [38])"This thread already has an EventLoop.");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  *(EventLoop **)(*in_FS_OFFSET + -0x28) = this;
  return;
}

Assistant:

void EventLoop::enterScope() {
  KJ_REQUIRE(threadLocalEventLoop == nullptr, "This thread already has an EventLoop.");
  threadLocalEventLoop = this;
}